

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_specialization_constant_op
          (CompilerGLSL *this,SPIRConstantOp *constant)

{
  uint32_t uVar1;
  SPIRType *pSVar2;
  undefined1 local_90 [80];
  string local_40 [8];
  string name;
  SPIRType *type;
  SPIRConstantOp *constant_local;
  CompilerGLSL *this_local;
  
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&constant->basetype);
  pSVar2 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar1);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(constant->super_IVariant).self);
  (*(this->super_Compiler)._vptr_Compiler[6])(local_40,this,(ulong)uVar1,1);
  (*(this->super_Compiler)._vptr_Compiler[0x1a])(local_90 + 0x30,this,pSVar2,local_40,0);
  constant_op_expression_abi_cxx11_((CompilerGLSL *)local_90,(SPIRConstantOp *)this);
  statement<char_const(&)[7],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
            (this,(char (*) [7])0x4daeb0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_90 + 0x30),
             (char (*) [4])0x4f38c2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
             (char (*) [2])0x4d9ce2);
  ::std::__cxx11::string::~string((string *)local_90);
  ::std::__cxx11::string::~string((string *)(local_90 + 0x30));
  ::std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void CompilerGLSL::emit_specialization_constant_op(const SPIRConstantOp &constant)
{
	auto &type = get<SPIRType>(constant.basetype);
	auto name = to_name(constant.self);
	statement("const ", variable_decl(type, name), " = ", constant_op_expression(constant), ";");
}